

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int readOperands(InternalInstruction *insn)

{
  bool bVar1;
  byte bVar2;
  Reg RVar3;
  int iVar4;
  ulong uVar5;
  Reg RVar6;
  int iVar7;
  uint8_t size;
  OperandSpecifier (*paOVar8) [6];
  long lVar9;
  bool bVar10;
  bool bVar11;
  
  bVar11 = false;
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
    bVar2 = insn->vectorExtensionPrefix[1];
    break;
  case TYPE_VEX_3B:
  case TYPE_XOP:
    bVar2 = insn->vectorExtensionPrefix[2];
    break;
  case TYPE_EVEX:
    bVar2 = (insn->vectorExtensionPrefix[2] >> 3 & 0xf |
            insn->vectorExtensionPrefix[3] * '\x02' & 0x10) ^ 0x1f;
    goto LAB_001a634b;
  default:
    bVar1 = false;
    goto LAB_001a6365;
  }
  bVar2 = (byte)~bVar2 >> 3 & 0xf;
LAB_001a634b:
  RVar3 = bVar2 & MODRM_REG_BH;
  if (insn->mode == MODE_64BIT) {
    RVar3 = (uint)bVar2;
  }
  insn->vvvv = RVar3;
  bVar1 = true;
LAB_001a6365:
  if (bVar1) {
    bVar11 = insn->vvvv != MODRM_REG_AL;
  }
  bVar10 = false;
  paOVar8 = x86OperandSets;
  lVar9 = 5;
  iVar7 = -1;
  do {
    uVar5 = (ulong)insn->spec->operands;
    switch(((OperandSpecifier *)((long)paOVar8 + uVar5 * 6 * 2))->encoding) {
    case '\0':
    case '\x19':
    case '\x1d':
    case '\x1e':
    case '\x1f':
      break;
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\b':
      iVar4 = readModRM(insn);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = fixupReg(insn,(OperandSpecifier *)
                            ((long)paOVar8 + (ulong)insn->spec->operands * 6 * 2));
      if (iVar4 != 0) {
        return -1;
      }
      if ((((OperandSpecifier *)((long)paOVar8 + (ulong)insn->spec->operands * 6 * 2))->encoding !=
           '\x01') && (insn->eaDisplacement == EA_DISP_8)) {
        insn->displacement =
             insn->displacement <<
             (((OperandSpecifier *)((long)paOVar8 + (ulong)insn->spec->operands * 6 * 2))->encoding
              - 2 & 0x1f);
      }
      break;
    case '\t':
      if (!bVar1) {
        return -1;
      }
      iVar4 = fixupReg(insn,(OperandSpecifier *)((long)paOVar8 + uVar5 * 6 * 2));
      bVar11 = false;
      goto LAB_001a658c;
    case '\n':
      if (insn->vectorExtensionType != TYPE_EVEX) {
        return -1;
      }
      insn->writemask = insn->vectorExtensionPrefix[3] & MODRM_REG_BH;
      break;
    default:
      goto switchD_001a63bf_caseD_b;
    case '\x11':
      if (bVar10) {
        bVar2 = insn->numImmediatesConsumed;
        insn->immediates[bVar2] = (ulong)((uint)insn->immediates[(ulong)bVar2 - 1] & 0xf);
        insn->numImmediatesConsumed = bVar2 + 1;
        bVar10 = true;
      }
      else {
        iVar4 = readImmediate(insn,'\x01');
        if (iVar4 != 0) {
          return -1;
        }
        bVar10 = (byte)(((OperandSpecifier *)((long)paOVar8 + (ulong)insn->spec->operands * 6 * 2))
                        ->type - 0x3f) < 2;
      }
      break;
    case '\x12':
      size = '\x02';
      goto LAB_001a6587;
    case '\x13':
      size = '\x04';
      goto LAB_001a6587;
    case '\x14':
      size = '\b';
      goto LAB_001a6587;
    case '\x15':
      insn->operandSize = '\x01';
switchD_001a6491_caseD_1:
      RVar6 = *(int *)&insn->rexPrefix * 8 & MODRM_REG_R8B;
      RVar3 = insn->opcode & MODRM_REG_BH | RVar6;
      insn->opcodeRegister = RVar3;
      if (((RVar6 == MODRM_REG_AL) && ((char)*(int *)&insn->rexPrefix != '\0')) && (3 < (byte)RVar3)
         ) {
        RVar3 = RVar3 + MODRM_REG_R12B;
        goto LAB_001a6544;
      }
      break;
    case '\x16':
      insn->operandSize = '\x02';
switchD_001a6491_caseD_2:
      RVar3 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_AX;
      goto LAB_001a6544;
    case '\x17':
      insn->operandSize = '\x04';
switchD_001a6491_caseD_4:
      RVar3 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_EAX;
      goto LAB_001a6544;
    case '\x18':
      insn->operandSize = '\b';
switchD_001a6491_caseD_8:
      RVar3 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_RAX;
LAB_001a6544:
      insn->opcodeRegister = RVar3;
      break;
    case '\x1a':
      size = insn->immediateSize;
      goto LAB_001a6587;
    case '\x1b':
      size = insn->addressSize;
LAB_001a6587:
      iVar4 = readImmediate(insn,size);
LAB_001a658c:
      if (iVar4 != 0) {
        return -1;
      }
      break;
    case '\x1c':
      insn->operandSize = insn->registerSize;
      switch(insn->registerSize) {
      case '\x01':
        goto switchD_001a6491_caseD_1;
      case '\x02':
        goto switchD_001a6491_caseD_2;
      case '\x04':
        goto switchD_001a6491_caseD_4;
      case '\b':
        goto switchD_001a6491_caseD_8;
      }
    }
    paOVar8 = (OperandSpecifier (*) [6])((long)paOVar8 + 2);
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  iVar7 = -(uint)bVar11;
switchD_001a63bf_caseD_b:
  return iVar7;
}

Assistant:

static int readOperands(struct InternalInstruction *insn)
{
	int index;
	int hasVVVV, needVVVV;
	int sawRegImm = 0;

	// printf(">>> readOperands()\n");
	/* If non-zero vvvv specified, need to make sure one of the operands
	   uses it. */
	hasVVVV = !readVVVV(insn);
	needVVVV = hasVVVV && (insn->vvvv != 0);

	for (index = 0; index < X86_MAX_OPERANDS; ++index) {
		//printf(">>> encoding[%u] = %u\n", index, x86OperandSets[insn->spec->operands][index].encoding);
		switch (x86OperandSets[insn->spec->operands][index].encoding) {
			case ENCODING_NONE:
			case ENCODING_SI:
			case ENCODING_DI:
				break;
			case ENCODING_REG:
			CASE_ENCODING_RM:
				if (readModRM(insn))
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				// Apply the AVX512 compressed displacement scaling factor.
				if (x86OperandSets[insn->spec->operands][index].encoding != ENCODING_REG && insn->eaDisplacement == EA_DISP_8)
					insn->displacement *= 1 << (x86OperandSets[insn->spec->operands][index].encoding - ENCODING_RM);
				break;
			case ENCODING_CB:
			case ENCODING_CW:
			case ENCODING_CD:
			case ENCODING_CP:
			case ENCODING_CO:
			case ENCODING_CT:
				// dbgprintf(insn, "We currently don't hande code-offset encodings");
				return -1;
			case ENCODING_IB:
				if (sawRegImm) {
					/* Saw a register immediate so don't read again and instead split the
					   previous immediate.  FIXME: This is a hack. */
					insn->immediates[insn->numImmediatesConsumed] =
						insn->immediates[insn->numImmediatesConsumed - 1] & 0xf;
					++insn->numImmediatesConsumed;
					break;
				}
				if (readImmediate(insn, 1))
					return -1;
				if (x86OperandSets[insn->spec->operands][index].type == TYPE_XMM128 ||
						x86OperandSets[insn->spec->operands][index].type == TYPE_XMM256)
					sawRegImm = 1;
				break;
			case ENCODING_IW:
				if (readImmediate(insn, 2))
					return -1;
				break;
			case ENCODING_ID:
				if (readImmediate(insn, 4))
					return -1;
				break;
			case ENCODING_IO:
				if (readImmediate(insn, 8))
					return -1;
				break;
			case ENCODING_Iv:
				if (readImmediate(insn, insn->immediateSize))
					return -1;
				break;
			case ENCODING_Ia:
				if (readImmediate(insn, insn->addressSize))
					return -1;
				break;
			case ENCODING_RB:
				if (readOpcodeRegister(insn, 1))
					return -1;
				break;
			case ENCODING_RW:
				if (readOpcodeRegister(insn, 2))
					return -1;
				break;
			case ENCODING_RD:
				if (readOpcodeRegister(insn, 4))
					return -1;
				break;
			case ENCODING_RO:
				if (readOpcodeRegister(insn, 8))
					return -1;
				break;
			case ENCODING_Rv:
				if (readOpcodeRegister(insn, 0))
					return -1;
				break;
			case ENCODING_FP:
				break;
			case ENCODING_VVVV:
				needVVVV = 0; /* Mark that we have found a VVVV operand. */
				if (!hasVVVV)
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				break;
			case ENCODING_WRITEMASK:
				if (readMaskRegister(insn))
					return -1;
				break;
			case ENCODING_DUP:
				break;
			default:
				// dbgprintf(insn, "Encountered an operand with an unknown encoding.");
				return -1;
		}
	}

	/* If we didn't find ENCODING_VVVV operand, but non-zero vvvv present, fail */
	if (needVVVV) return -1;

	return 0;
}